

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp-rcnb-cli.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  char cVar2;
  codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *pcVar3;
  ostream *poVar4;
  decoder *this;
  locale utf8_locale;
  allocator local_4a9;
  decoder D;
  locale local_488;
  locale local_480;
  string choice;
  string output;
  string input;
  ofstream outstream;
  wifstream instream;
  
  if (argc == 4) {
    std::__cxx11::string::string((string *)&input,argv[2],(allocator *)&instream);
    std::__cxx11::string::string((string *)&output,argv[3],(allocator *)&instream);
    std::__cxx11::string::string((string *)&choice,argv[1],(allocator *)&instream);
    bVar1 = std::operator==(&choice,"-d");
    if (bVar1) {
      std::wifstream::wifstream(&instream,input._M_dataplus._M_p,_S_in|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::__cxx11::string::string
                  ((string *)&outstream,"Could not open input file!",(allocator *)&D);
        usage((string *)&outstream);
LAB_001037fe:
        this = (decoder *)&outstream;
        goto LAB_0010382b;
      }
      std::locale::locale((locale *)&outstream);
      pcVar3 = (codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *)operator_new(0x28);
      std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>::codecvt_utf8(pcVar3,0);
      std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
                (&utf8_locale,(locale *)&outstream,pcVar3);
      std::locale::~locale((locale *)&outstream);
      std::wios::imbue(&local_480);
      std::locale::~locale(&local_480);
      std::ofstream::ofstream(&outstream,output._M_dataplus._M_p,_S_out|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        D._buffersize = 0x1000;
        rcnb::decoder::decode(&D,(wistream *)&instream,(ostream *)&outstream);
        std::ofstream::~ofstream(&outstream);
        std::locale::~locale(&utf8_locale);
        std::wifstream::~wifstream(&instream);
        goto LAB_0010371b;
      }
      std::__cxx11::string::string((string *)&D,"Could not open output file!",&local_4a9);
      usage((string *)&D);
    }
    else {
      bVar1 = std::operator==(&choice,"-e");
      if (!bVar1) {
        poVar4 = std::operator<<((ostream *)&std::cout,"[");
        poVar4 = std::operator<<(poVar4,(string *)&choice);
        poVar4 = std::operator<<(poVar4,"]");
        std::endl<char,std::char_traits<char>>(poVar4);
        std::__cxx11::string::string
                  ((string *)&instream,"Please specify -d or -e as first argument!",
                   (allocator *)&outstream);
        usage((string *)&instream);
        std::__cxx11::string::~string((string *)&instream);
LAB_0010371b:
        std::__cxx11::string::~string((string *)&choice);
        std::__cxx11::string::~string((string *)&output);
        std::__cxx11::string::~string((string *)&input);
        return 0;
      }
      std::ifstream::ifstream(&instream,input._M_dataplus._M_p,_S_in|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 == '\0') {
        std::__cxx11::string::string
                  ((string *)&outstream,"Could not open input file!",(allocator *)&D);
        usage((string *)&outstream);
        goto LAB_001037fe;
      }
      std::wofstream::wofstream(&outstream,output._M_dataplus._M_p,_S_out|_S_bin);
      cVar2 = std::__basic_file<char>::is_open();
      if (cVar2 != '\0') {
        std::locale::locale(&utf8_locale);
        pcVar3 = (codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0> *)operator_new(0x28);
        std::codecvt_utf8<wchar_t,_1114111UL,_(std::codecvt_mode)0>::codecvt_utf8(pcVar3,0);
        std::locale::locale<std::codecvt_utf8<wchar_t,1114111ul,(std::codecvt_mode)0>>
                  ((locale *)&D,&utf8_locale,pcVar3);
        std::locale::~locale(&utf8_locale);
        std::wios::imbue(&local_488);
        std::locale::~locale(&local_488);
        utf8_locale._M_impl._4_4_ = 0x1000;
        rcnb::encoder::encode((encoder *)&utf8_locale,(istream *)&instream,(wostream *)&outstream);
        std::locale::~locale((locale *)&D);
        std::wofstream::~wofstream(&outstream);
        std::ifstream::~ifstream(&instream);
        goto LAB_0010371b;
      }
      std::__cxx11::string::string
                ((string *)&D,"Could not open output file!",(allocator *)&utf8_locale);
      usage((string *)&D);
    }
    this = &D;
  }
  else {
    if (argc == 1) {
      usage();
      goto LAB_00103830;
    }
    std::__cxx11::string::string
              ((string *)&instream,"Wrong number of arguments!",(allocator *)&outstream);
    usage((string *)&instream);
    this = (decoder *)&instream;
  }
LAB_0010382b:
  std::__cxx11::string::~string((string *)this);
LAB_00103830:
  exit(-1);
}

Assistant:

int main(int argc, char** argv)
{
    if (argc == 1)
    {
        usage();
        exit(-1);
    }
    if (argc != 4)
    {
        usage("Wrong number of arguments!");
        exit(-1);
    }

    std::string input = argv[2];
    std::string output = argv[3];

    // determine whether we need to encode or decode:
    std::string choice = argv[1];
    if (choice == "-d")
    {
        std::wifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        instream.imbue(utf8_locale);

        std::ofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        rcnb::decoder D;
        D.decode(instream, outstream);
    }
    else if (choice == "-e")
    {
        std::ifstream instream(input.c_str(), std::ios_base::in | std::ios_base::binary);
        if (!instream.is_open())
        {
            usage("Could not open input file!");
            exit(-1);
        }

        std::wofstream outstream(output.c_str(), std::ios_base::out | std::ios_base::binary);
        if (!outstream.is_open())
        {
            usage("Could not open output file!");
            exit(-1);
        }
        std::locale utf8_locale(std::locale(), new std::codecvt_utf8<wchar_t>);
        outstream.imbue(utf8_locale);
        rcnb::encoder E;
        E.encode(instream, outstream);
    }
    else
    {
        std::cout<<"["<<choice<<"]"<<std::endl;
        usage("Please specify -d or -e as first argument!");
    }

    return 0;
}